

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int indexCellCompare(BtCursor *pCur,int idx,UnpackedRecord *pIdxKey,RecordCompare xRecordCompare)

{
  byte bVar1;
  MemPage *pMVar2;
  ushort uVar3;
  byte *pbVar4;
  u8 *pCell;
  int nCell;
  int c;
  MemPage *pPage;
  RecordCompare xRecordCompare_local;
  UnpackedRecord *pIdxKey_local;
  int idx_local;
  BtCursor *pCur_local;
  
  pMVar2 = pCur->pPage;
  pbVar4 = pMVar2->aDataOfst +
           (int)(uint)(pMVar2->maskPage &
                      CONCAT11(pMVar2->aCellIdx[idx << 1],pMVar2->aCellIdx[(long)(idx << 1) + 1]));
  bVar1 = *pbVar4;
  if ((ushort)pMVar2->max1bytePayload < (ushort)bVar1) {
    if (((pbVar4[1] & 0x80) == 0) &&
       (uVar3 = (bVar1 & 0x7f) * 0x80 + (ushort)pbVar4[1], uVar3 <= pMVar2->maxLocal)) {
      pCell._4_4_ = (*xRecordCompare)((int)uVar3,pbVar4 + 2,pIdxKey);
    }
    else {
      pCell._4_4_ = 99;
    }
  }
  else {
    pCell._4_4_ = (*xRecordCompare)((uint)bVar1,pbVar4 + 1,pIdxKey);
  }
  return pCell._4_4_;
}

Assistant:

static int indexCellCompare(
  BtCursor *pCur,
  int idx,
  UnpackedRecord *pIdxKey,
  RecordCompare xRecordCompare
){
  MemPage *pPage = pCur->pPage;
  int c;
  int nCell;  /* Size of the pCell cell in bytes */
  u8 *pCell = findCellPastPtr(pPage, idx);

  nCell = pCell[0];
  if( nCell<=pPage->max1bytePayload ){
    /* This branch runs if the record-size field of the cell is a
    ** single byte varint and the record fits entirely on the main
    ** b-tree page.  */
    testcase( pCell+nCell+1==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
  }else if( !(pCell[1] & 0x80)
    && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
  ){
    /* The record-size field is a 2 byte varint and the record
    ** fits entirely on the main b-tree page.  */
    testcase( pCell+nCell+2==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
  }else{
    /* If the record extends into overflow pages, do not attempt
    ** the optimization. */
    c = 99;
  }
  return c;
}